

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O3

ExitStatus __thiscall Subprocess::Finish(Subprocess *this)

{
  __pid_t _Var1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  int status;
  uint local_c;
  
  if (this->pid_ == -1) {
    __assert_fail("pid_ != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess-posix.cc"
                  ,0x98,"ExitStatus Subprocess::Finish()");
  }
  _Var1 = waitpid(this->pid_,(int *)&local_c,0);
  if (-1 < _Var1) {
    this->pid_ = -1;
    uVar4 = local_c & 0x7f;
    if (uVar4 == 0) {
      if ((local_c & 0xff00) == 0) {
        return ExitSuccess;
      }
    }
    else if (((0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) && (uVar4 < 0x10)) &&
            ((0x8006U >> (local_c & 0x1f) & 1) != 0)) {
      return ExitInterrupted;
    }
    return ExitFailure;
  }
  uVar4 = this->pid_;
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  Fatal("waitpid(%d): %s",(ulong)uVar4,pcVar3);
}

Assistant:

ExitStatus Subprocess::Finish() {
  assert(pid_ != -1);
  int status;
  if (waitpid(pid_, &status, 0) < 0)
    Fatal("waitpid(%d): %s", pid_, strerror(errno));
  pid_ = -1;

#ifdef _AIX
  if (WIFEXITED(status) && WEXITSTATUS(status) & 0x80) {
    // Map the shell's exit code used for signal failure (128 + signal) to the
    // status code expected by AIX WIFSIGNALED and WTERMSIG macros which, unlike
    // other systems, uses a different bit layout.
    int signal = WEXITSTATUS(status) & 0x7f;
    status = (signal << 16) | signal;
  }
#endif

  if (WIFEXITED(status)) {
    int exit = WEXITSTATUS(status);
    if (exit == 0)
      return ExitSuccess;
  } else if (WIFSIGNALED(status)) {
    if (WTERMSIG(status) == SIGINT || WTERMSIG(status) == SIGTERM
        || WTERMSIG(status) == SIGHUP)
      return ExitInterrupted;
  }
  return ExitFailure;
}